

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented::addAssertsInNonInstrumented(wasm::
Function*)::Walker::handleCall(wasm::Expression__(void *this,Expression *call)

{
  Index index;
  Builder *pBVar1;
  Builder *this_00;
  Builder *pBVar2;
  Name name;
  If *right;
  If *left;
  bool bVar3;
  GlobalGet *left_00;
  LocalGet *right_00;
  Binary *condition;
  Expression *ifTrue;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> local_c8;
  optional<wasm::Type> local_b0;
  uintptr_t local_a0;
  LocalSet *local_98;
  If *local_90;
  LocalGet *local_88;
  initializer_list<wasm::Expression_*> local_80;
  uintptr_t local_70;
  Index local_64;
  Block *pBStack_60;
  Index temp;
  Expression *rep;
  optional<wasm::Type> local_50;
  Type local_40;
  Type local_38;
  size_t local_30;
  char *local_28;
  If *local_20;
  If *check;
  Expression *call_local;
  Walker *this_local;
  
  pBVar1 = *(Builder **)((long)this + 0xe0);
  this_00 = *(Builder **)((long)this + 0xe0);
  pBVar2 = *(Builder **)((long)this + 0xe0);
  local_30 = ASYNCIFY_STATE;
  local_28 = DAT_031935d8;
  check = (If *)call;
  call_local = (Expression *)this;
  wasm::Type::Type(&local_38,i32);
  name.super_IString.str._M_str = local_28;
  name.super_IString.str._M_len = local_30;
  left_00 = Builder::makeGlobalGet(pBVar2,name,local_38);
  pBVar2 = *(Builder **)((long)this + 0xe0);
  index = *(Index *)((long)this + 0xe8);
  wasm::Type::Type(&local_40,i32);
  right_00 = Builder::makeLocalGet(pBVar2,index,local_40);
  condition = Builder::makeBinary(this_00,NeInt32,(Expression *)left_00,(Expression *)right_00);
  ifTrue = (Expression *)Builder::makeUnreachable(*(Builder **)((long)this + 0xe0));
  std::optional<wasm::Type>::optional(&local_50);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_50.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_50.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  local_20 = Builder::makeIf(pBVar1,(Expression *)condition,ifTrue,(Expression *)0x0,type);
  bVar3 = wasm::Type::isConcrete
                    (&(check->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.
                      type);
  left = check;
  right = local_20;
  if (bVar3) {
    local_70 = (check->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id;
    local_64 = Builder::addVar(*(Function **)((long)this + 0xd8),(Type)local_70);
    pBVar1 = *(Builder **)((long)this + 0xe0);
    local_98 = Builder::makeLocalSet(*(Builder **)((long)this + 0xe0),local_64,(Expression *)check);
    local_90 = local_20;
    local_a0 = (check->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id;
    local_88 = Builder::makeLocalGet(*(Builder **)((long)this + 0xe0),local_64,(Type)local_a0);
    local_80._M_array = (iterator)&local_98;
    local_80._M_len = 3;
    std::optional<wasm::Type>::optional(&local_b0);
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_b0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_b0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    pBStack_60 = Builder::makeBlock(pBVar1,&local_80,type_01);
  }
  else {
    pBVar1 = *(Builder **)((long)this + 0xe0);
    std::optional<wasm::Type>::optional(&local_c8);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_c8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_c8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    pBStack_60 = Builder::makeSequence(pBVar1,(Expression *)left,(Expression *)right,type_00);
  }
  Walker<Walker,_wasm::Visitor<Walker,_void>_>::replaceCurrent
            ((Walker<Walker,_wasm::Visitor<Walker,_void>_> *)this,(Expression *)pBStack_60);
  return;
}

Assistant:

void handleCall(Expression* call) {
        auto* check = builder->makeIf(
          builder->makeBinary(NeInt32,
                              builder->makeGlobalGet(ASYNCIFY_STATE, Type::i32),
                              builder->makeLocalGet(oldState, Type::i32)),
          builder->makeUnreachable());
        Expression* rep;
        if (call->type.isConcrete()) {
          auto temp = builder->addVar(func, call->type);
          rep = builder->makeBlock({
            builder->makeLocalSet(temp, call),
            check,
            builder->makeLocalGet(temp, call->type),
          });
        } else {
          rep = builder->makeSequence(call, check);
        }
        replaceCurrent(rep);
      }